

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

void __thiscall rengine::SDLBackend::requestRender(SDLBackend *this)

{
  undefined4 uStack_64;
  SDL_UserEvent renderev;
  SDL_Event event;
  SDLBackend *this_local;
  
  if ((this->m_renderRequested & 1U) == 0) {
    this->m_renderRequested = true;
    renderev.timestamp = 0;
    renderev.data1 = (void *)0x0;
    renderev.data2 = (void *)CONCAT44(uStack_64,0x8000);
    renderev._8_8_ = this;
    SDL_PushEvent(&renderev.data2);
  }
  return;
}

Assistant:

inline void SDLBackend::requestRender() {
    if (m_renderRequested)
        return;
    m_renderRequested = true;
    // we can't trigger the render synchronously. we need to give a chance
    // to process input, animations, whatever -- so push an event onto the
    // queue and we'll get back to this later.
    SDL_Event event;

    SDL_UserEvent renderev;
    renderev.type = SDL_USEREVENT;
    renderev.code = 0;
    renderev.data1 = this;
    renderev.data2 = NULL;

    event.type = SDL_USEREVENT;
    event.user = renderev;

    SDL_PushEvent(&event);
}